

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

bool __thiscall
dg::dda::MemorySSATransformation::callMayDefineTarget
          (MemorySSATransformation *this,RWNodeCall *C,RWNode *target)

{
  pointer pRVar1;
  RWSubgraph *s;
  type tVar2;
  bool bVar3;
  SubgraphInfo *si;
  RWCalledValue *callee;
  pointer pRVar4;
  Offset local_38;
  
  tVar2 = Offset::UNKNOWN;
  pRVar1 = (C->callees).
           super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (C->callees).
                super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
    s = pRVar4->subgraph;
    if (s == (RWSubgraph *)0x0) {
      local_38.offset = tVar2;
      bVar3 = RWNode::defines(pRVar4->calledValue,target,&local_38);
    }
    else {
      si = getSubgraphInfo(this,s);
      computeModRef(this,s,si);
      bVar3 = ModRefInfo::mayDefineOrUnknown(&si->modref,target);
    }
    if (bVar3 != false) break;
  }
  return pRVar4 != pRVar1;
}

Assistant:

bool MemorySSATransformation::callMayDefineTarget(RWNodeCall *C,
                                                  RWNode *target) {
    // check if this call may define the memory at all
    for (auto &callee : C->getCallees()) {
        auto *subg = callee.getSubgraph();
        if (!subg) {
            auto *cv = callee.getCalledValue();
            if (cv->defines(target)) {
                return true;
            }
        } else {
            auto &si = getSubgraphInfo(subg);
            computeModRef(subg, si);
            assert(si.modref.isInitialized());
            if (si.modref.mayDefineOrUnknown(target)) {
                return true;
            }
        }
    }

    return false;
}